

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall ArrayState<true>::StartArray(ArrayState<true> *this,Context<true> *ctx)

{
  stringstream *psVar1;
  Namespace<true> *pNVar2;
  long in_RSI;
  BaseState<true> *in_RDI;
  Context<true> *unaff_retaddr;
  BaseState<true> *in_stack_00000060;
  char *in_stack_00000068;
  Context<true> *in_stack_00000070;
  BaseState<true> *local_8;
  
  if (*(BaseState<true> **)(in_RSI + 0x28) == in_RDI) {
    psVar1 = Context<true>::error_abi_cxx11_(unaff_retaddr);
    std::operator<<((ostream *)(psVar1 + 0x10),"Nested arrays are not supported");
    local_8 = (BaseState<true> *)0x0;
  }
  else {
    Context<true>::PushNamespace(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    pNVar2 = Context<true>::CurrentNamespace((Context<true> *)0x2a9171);
    in_RDI[1]._vptr_BaseState = (_func_int **)pNVar2->namespace_hash;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    if (ctx.previous_state == this)
    {
      ctx.error() << "Nested arrays are not supported";
      return nullptr;
    }

    ctx.PushNamespace(ctx.key, ctx.previous_state);

    array_hash = ctx.CurrentNamespace().namespace_hash;

    return this;
  }